

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_31::WebSocketPipeImpl::BlockedSend::receive(BlockedSend *this)

{
  bool bVar1;
  Tag TVar2;
  ArrayPtr<const_unsigned_char> *this_00;
  size_t sVar3;
  uchar *__dest;
  uchar *__src;
  Array<unsigned_char> *other;
  ArrayPtr<const_char> *params;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  StringPtr *params_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar4;
  WebSocket *in_RSI;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> PVar5;
  Close local_130;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_110;
  ClosePtr *local_e8;
  ClosePtr *_kj_switch_done_2;
  ClosePtr *close;
  undefined1 local_b0 [8];
  Array<unsigned_char> copy;
  ArrayPtr<const_unsigned_char> *_kj_switch_done_1;
  ArrayPtr<const_unsigned_char> *arr_1;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_70;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *_kj_switch_done;
  ArrayPtr<const_char> *arr;
  OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
  *_kj_switch_subject;
  Fault local_20;
  Fault f;
  BlockedSend *this_local;
  
  bVar1 = Canceler::isEmpty((Canceler *)(in_RSI + 7));
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xaa2,FAILED,"canceler.isEmpty()","\"already pumping\"",
               (char (*) [16])"already pumping");
    _::Debug::Fault::fatal(&local_20);
  }
  (**(code **)*in_RSI[1]._vptr_WebSocket)(in_RSI[1]._vptr_WebSocket,(long)&_kj_switch_subject + 3);
  endState((WebSocketPipeImpl *)in_RSI[2]._vptr_WebSocket,in_RSI);
  arr = (ArrayPtr<const_char> *)
        OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
        ::_switchSubject((OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
                          *)(in_RSI + 3));
  TVar2 = OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
          ::which((OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
                   *)arr);
  if (TVar2 == _variant0) {
    local_48 = OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
               ::get<kj::ArrayPtr<char_const>>
                         ((OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
                           *)arr);
    if (local_48 != (ArrayPtr<const_char> *)0x0) {
      _kj_switch_done = local_48;
      str<kj::ArrayPtr<char_const>&>((String *)&arr_1,(kj *)local_48,params);
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::OneOf<kj::String>
                (&local_70,(String *)&arr_1);
      Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::Promise
                ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
                 this,&local_70);
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf(&local_70);
      String::~String((String *)&arr_1);
      pPVar4 = extraout_RDX;
LAB_004c7379:
      PVar5.super_PromiseBase.node.ptr = pPVar4;
      PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
      return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
             PVar5.super_PromiseBase.node;
    }
    local_48 = (ArrayPtr<const_char> *)0x0;
    _kj_switch_done = (ArrayPtr<const_char> *)0x0;
  }
  else if (TVar2 == _variant1) {
    this_00 = OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
              ::get<kj::ArrayPtr<unsigned_char_const>>
                        ((OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
                          *)arr);
    if (this_00 != (ArrayPtr<const_unsigned_char> *)0x0) {
      copy.disposer = (ArrayDisposer *)this_00;
      sVar3 = ArrayPtr<const_unsigned_char>::size(this_00);
      heapArray<unsigned_char>((Array<unsigned_char> *)local_b0,sVar3);
      __dest = Array<unsigned_char>::begin((Array<unsigned_char> *)local_b0);
      __src = ArrayPtr<const_unsigned_char>::begin(this_00);
      sVar3 = ArrayPtr<const_unsigned_char>::size(this_00);
      memcpy(__dest,__src,sVar3);
      other = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)local_b0);
      OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>::
      OneOf<kj::Array<unsigned_char>>
                ((OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close> *)&close,other);
      Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::Promise
                ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
                 this,(FixVoid<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                       *)&close);
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf
                ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)&close);
      Array<unsigned_char>::~Array((Array<unsigned_char> *)local_b0);
      pPVar4 = extraout_RDX_00;
      goto LAB_004c7379;
    }
    copy.disposer = (ArrayDisposer *)0x0;
  }
  else if (TVar2 == _variant2) {
    local_e8 = OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
               ::get<kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
                         ((OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
                           *)arr);
    if (local_e8 != (ClosePtr *)0x0) {
      local_130.code = local_e8->code;
      _kj_switch_done_2 = local_e8;
      str<kj::StringPtr&>(&local_130.reason,(kj *)&local_e8->reason,params_00);
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::OneOf<kj::WebSocket::Close>
                (&local_110,&local_130);
      Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::Promise
                ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
                 this,&local_110);
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf(&local_110);
      WebSocket::Close::~Close(&local_130);
      pPVar4 = extraout_RDX_01;
      goto LAB_004c7379;
    }
    local_e8 = (ClosePtr *)0x0;
    _kj_switch_done_2 = (ClosePtr *)0x0;
  }
  _::unreachable();
}

Assistant:

kj::Promise<Message> receive() override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");
      fulfiller.fulfill();
      pipe.endState(*this);
      KJ_SWITCH_ONEOF(message) {
        KJ_CASE_ONEOF(arr, kj::ArrayPtr<const char>) {
          return Message(kj::str(arr));
        }
        KJ_CASE_ONEOF(arr, kj::ArrayPtr<const byte>) {
          auto copy = kj::heapArray<byte>(arr.size());
          memcpy(copy.begin(), arr.begin(), arr.size());
          return Message(kj::mv(copy));
        }
        KJ_CASE_ONEOF(close, ClosePtr) {
          return Message(Close { close.code, kj::str(close.reason) });
        }
      }
      KJ_UNREACHABLE;
    }